

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginVST2.cpp
# Opt level: O1

void __thiscall
DISTRHO::PluginVst::PluginVst(PluginVst *this,audioMasterCallback audioMaster,AEffect *effect)

{
  PrivateData *pPVar1;
  float *pfVar2;
  uint32_t i;
  ulong uVar3;
  uint uVar4;
  
  (this->super_ParameterAndNotesHelper).parameterValues = (float *)0x0;
  (this->super_ParameterAndNotesHelper)._vptr_ParameterAndNotesHelper =
       (_func_int **)&PTR__PluginVst_0010fc80;
  PluginExporter::PluginExporter
            (&this->fPlugin,this,(writeMidiFunc)0x0,(requestParameterValueChangeFunc)0x0);
  this->fAudioMaster = audioMaster;
  this->fEffect = effect;
  builtin_strncpy(this->fProgramName,"Default",8);
  this->fProgramName[8] = '\0';
  this->fProgramName[9] = '\0';
  this->fProgramName[10] = '\0';
  this->fProgramName[0xb] = '\0';
  this->fProgramName[0xc] = '\0';
  this->fProgramName[0xd] = '\0';
  this->fProgramName[0xe] = '\0';
  this->fProgramName[0xf] = '\0';
  this->fProgramName[0x10] = '\0';
  this->fProgramName[0x11] = '\0';
  this->fProgramName[0x12] = '\0';
  this->fProgramName[0x13] = '\0';
  this->fProgramName[0x14] = '\0';
  this->fProgramName[0x15] = '\0';
  this->fProgramName[0x16] = '\0';
  this->fProgramName[0x17] = '\0';
  this->fProgramName[0x18] = '\0';
  this->fProgramName[0x19] = '\0';
  this->fProgramName[0x1a] = '\0';
  this->fProgramName[0x1b] = '\0';
  this->fProgramName[0x1c] = '\0';
  this->fProgramName[0x1d] = '\0';
  this->fProgramName[0x1e] = '\0';
  this->fProgramName[0x1f] = '\0';
  this->fProgramName[0x20] = '\0';
  pPVar1 = (this->fPlugin).fData;
  if (pPVar1 == (PrivateData *)0x0) {
    uVar4 = 0;
    d_stderr2("assertion failure: \"%s\" in file %s, line %i","fData != nullptr",
              "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/dpf/distrho/src/DistrhoPluginInternal.hpp"
             );
  }
  else {
    uVar4 = pPVar1->parameterCount;
  }
  if (uVar4 != 0) {
    pfVar2 = (float *)operator_new__((ulong)uVar4 * 4);
    (this->super_ParameterAndNotesHelper).parameterValues = pfVar2;
    uVar3 = 0;
    do {
      pfVar2[uVar3] = NAN;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  return;
}

Assistant:

PluginVst(const audioMasterCallback audioMaster, AEffect* const effect)
        : fPlugin(this, writeMidiCallback, requestParameterValueChangeCallback),
          fAudioMaster(audioMaster),
          fEffect(effect)
    {
        std::memset(fProgramName, 0, sizeof(char)*(32+1));
        std::strcpy(fProgramName, "Default");

        const uint32_t parameterCount = fPlugin.getParameterCount();

        if (parameterCount != 0)
        {
            parameterValues = new float[parameterCount];

            for (uint32_t i=0; i < parameterCount; ++i)
                parameterValues[i] = NAN;
        }

#if DISTRHO_PLUGIN_WANT_MIDI_INPUT
        fMidiEventCount = 0;
#endif

#if DISTRHO_PLUGIN_HAS_UI
        fVstUI           = nullptr;
        fVstRect.top     = 0;
        fVstRect.left    = 0;
        fVstRect.bottom  = 0;
        fVstRect.right   = 0;
        fLastScaleFactor = 0.0f;

        if (parameterCount != 0)
        {
            parameterChecks = new bool[parameterCount];
            memset(parameterChecks, 0, sizeof(bool)*parameterCount);
        }

# if DISTRHO_OS_MAC
#  ifdef __LP64__
        fUsingNsView = true;
#  else
#   ifndef DISTRHO_NO_WARNINGS
#    warning 32bit VST UIs on OSX only work if the host supports "hasCockosViewAsConfig"
#   endif
        fUsingNsView = false;
#  endif
# endif // DISTRHO_OS_MAC

# if DISTRHO_PLUGIN_WANT_MIDI_INPUT
        fNotesRingBuffer.setRingBuffer(&notesRingBuffer, true);
# endif
#endif // DISTRHO_PLUGIN_HAS_UI

#if DISTRHO_PLUGIN_WANT_STATE
        fStateChunk = nullptr;

        for (uint32_t i=0, count=fPlugin.getStateCount(); i<count; ++i)
        {
            const String& dkey(fPlugin.getStateKey(i));
            fStateMap[dkey] = fPlugin.getStateDefaultValue(i);
        }
#endif
    }